

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

void __thiscall QHexView::copyAs(QHexView *this,CopyMode mode)

{
  char cVar1;
  QHexDocument *pQVar2;
  bool bVar3;
  void *__buf;
  char *pcVar4;
  ulong uVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QString t;
  QString hexchar;
  QByteArray bytes;
  QArrayData *local_f0 [2];
  undefined8 local_e0;
  QArrayData *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  QArrayData *local_b8 [3];
  undefined1 local_a0 [16];
  QHexBuffer *local_90;
  QArrayData *local_88 [2];
  undefined8 local_78;
  uint local_6c;
  QHexView *local_68;
  undefined8 local_60;
  QArrayData *local_58 [2];
  undefined8 local_48;
  ulong local_38;
  
  local_60 = QGuiApplication::clipboard();
  bVar3 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar3) {
    QHexCursor::selectedBytes((QByteArray *)local_a0,this->m_hexcursor);
  }
  else {
    pQVar2 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)local_a0,(int)pQVar2,__buf,1);
  }
  local_68 = this;
  if (mode - HexArraySquare < 2) {
    local_d8 = (QArrayData *)0x0;
    uStack_d0 = 0;
    local_c8 = 0;
    if (((QArrayData *)local_a0._0_8_ == (QArrayData *)0x0) ||
       (1 < (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)local_a0,(AllocationOption)local_90);
    }
    pcVar4 = (char *)local_a0._8_8_;
    local_38 = (ulong)mode;
    if (((QArrayData *)local_a0._0_8_ == (QArrayData *)0x0) ||
       (1 < (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)local_a0,(AllocationOption)local_90);
    }
    if (pcVar4 != (char *)(local_a0._8_8_ + (long)local_90)) {
      local_6c = 0;
      do {
        cVar1 = *pcVar4;
        if (local_c8 != 0) {
          QVar6.m_data = (storage_type *)0x2;
          QVar6.m_size = (qsizetype)local_f0;
          QString::fromUtf8(QVar6);
          QString::append((QString *)&local_d8);
          if (local_f0[0] != (QArrayData *)0x0) {
            LOCK();
            (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_f0[0],2,8);
            }
          }
          if (((local_68->m_options).copybreak == true) &&
             (local_6c = local_6c + 1, local_6c % (local_68->m_options).linelength == 0)) {
            QVar8.m_data = (storage_type *)0x1;
            QVar8.m_size = (qsizetype)local_f0;
            QString::fromUtf8(QVar8);
            QString::append((QString *)&local_d8);
            if (local_f0[0] != (QArrayData *)0x0) {
              LOCK();
              (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_f0[0],2,8);
              }
            }
          }
        }
        QString::number((uint)local_88,(int)cVar1);
        QString::toUpper_helper((QString *)local_b8);
        QVar7.m_data = (storage_type *)0x2;
        QVar7.m_size = (qsizetype)local_f0;
        QString::fromUtf8(QVar7);
        QString::append((QString *)local_f0);
        QString::append((QString *)&local_d8);
        if (local_f0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_f0[0],2,8);
          }
        }
        if (local_b8[0] != (QArrayData *)0x0) {
          LOCK();
          (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8[0],2,8);
          }
        }
        if (local_88[0] != (QArrayData *)0x0) {
          LOCK();
          (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88[0],2,8);
          }
        }
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != (char *)(local_a0._8_8_ + (long)local_90));
    }
    QVar11.m_data = (storage_type *)0x4;
    QVar11.m_size = (qsizetype)local_f0;
    QString::fromUtf8(QVar11);
    local_88[0] = local_f0[0];
    local_88[1] = local_f0[1];
    local_78 = local_e0;
    QString::arg((QString *)local_b8,(int)local_88,(QChar)(char16_t)&local_d8);
    QClipboard::setText(local_60,local_b8,0);
  }
  else {
    if (mode != HexArrayChar) {
      local_d8 = (QArrayData *)0x0;
      uStack_d0 = 0;
      local_c8 = 0;
      if (0 < (long)local_90) {
        uVar5 = 0;
        do {
          if ((int)((uVar5 & 0xffffffff) % (ulong)(local_68->m_options).grouplength) == 0) {
            if (local_c8 != 0) {
              QVar13.m_data = (storage_type *)0x2;
              QVar13.m_size = (qsizetype)local_f0;
              QString::fromUtf8(QVar13);
              QString::append((QString *)&local_d8);
              if (local_f0[0] != (QArrayData *)0x0) {
                LOCK();
                (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_f0[0],2,8);
                }
              }
              if (((local_68->m_options).copybreak == true) &&
                 ((int)((uVar5 & 0xffffffff) % (ulong)(local_68->m_options).linelength) == 0)) {
                QVar15.m_data = (storage_type *)0x1;
                QVar15.m_size = (qsizetype)local_f0;
                QString::fromUtf8(QVar15);
                QString::append((QString *)&local_d8);
                if (local_f0[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_f0[0],2,8);
                  }
                }
              }
            }
            QVar14.m_data = (storage_type *)0x2;
            QVar14.m_size = (qsizetype)local_f0;
            QString::fromUtf8(QVar14);
            QString::append((QString *)&local_d8);
            if (local_f0[0] != (QArrayData *)0x0) {
              LOCK();
              (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_f0[0],2,8);
              }
            }
          }
          QVar12.m_data = (storage_type *)0x2;
          QVar12.m_size = (qsizetype)local_f0;
          QString::fromUtf8(QVar12);
          local_58[0] = local_f0[0];
          local_58[1] = local_f0[1];
          local_48 = local_e0;
          if (((QArrayData *)local_a0._0_8_ == (QArrayData *)0x0) ||
             (1 < (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
            QByteArray::reallocData((longlong)local_a0,(AllocationOption)local_90);
          }
          QString::arg((ulonglong)local_88,(int)local_58,(int)*(char *)(local_a0._8_8_ + uVar5),
                       (QChar)0x2);
          QString::toUpper_helper((QString *)local_b8);
          QString::append((QString *)&local_d8);
          if (local_b8[0] != (QArrayData *)0x0) {
            LOCK();
            (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_b8[0],2,8);
            }
          }
          if (local_88[0] != (QArrayData *)0x0) {
            LOCK();
            (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_88[0],2,8);
            }
          }
          if (local_58[0] != (QArrayData *)0x0) {
            LOCK();
            (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58[0],2,8);
            }
          }
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)local_90);
      }
      QClipboard::setText(local_60,&local_d8,0);
      goto LAB_001c2595;
    }
    local_d8 = (QArrayData *)0x0;
    uStack_d0 = 0;
    local_c8 = 0;
    if (((QArrayData *)local_a0._0_8_ == (QArrayData *)0x0) ||
       (1 < (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)local_a0,(AllocationOption)local_90);
    }
    pcVar4 = (char *)local_a0._8_8_;
    if (((QArrayData *)local_a0._0_8_ == (QArrayData *)0x0) ||
       (1 < (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)local_a0,(AllocationOption)local_90);
    }
    if (pcVar4 != (char *)(local_a0._8_8_ + (long)local_90)) {
      do {
        QString::number((uint)local_88,(int)*pcVar4);
        QString::toUpper_helper((QString *)local_b8);
        QVar9.m_data = (storage_type *)0x2;
        QVar9.m_size = (qsizetype)local_f0;
        QString::fromUtf8(QVar9);
        QString::append((QString *)local_f0);
        QString::append((QString *)&local_d8);
        if (local_f0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_f0[0],2,8);
          }
        }
        if (local_b8[0] != (QArrayData *)0x0) {
          LOCK();
          (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8[0],2,8);
          }
        }
        if (local_88[0] != (QArrayData *)0x0) {
          LOCK();
          (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88[0],2,8);
          }
        }
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != (char *)(local_a0._8_8_ + (long)local_90));
    }
    QVar10.m_data = (storage_type *)0x4;
    QVar10.m_size = (qsizetype)local_f0;
    QString::fromUtf8(QVar10);
    local_88[0] = local_f0[0];
    local_88[1] = local_f0[1];
    local_78 = local_e0;
    QString::arg((QString *)local_b8,(int)local_88,(QChar)(char16_t)&local_d8);
    QClipboard::setText(local_60,local_b8,0);
  }
  if (local_b8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8[0],2,8);
    }
  }
  if (local_88[0] != (QArrayData *)0x0) {
    LOCK();
    (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88[0],2,8);
    }
  }
LAB_001c2595:
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,8);
    }
  }
  if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a0._0_8_,1,8);
    }
  }
  return;
}

Assistant:

void QHexView::copyAs(CopyMode mode) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    switch(mode) {
        case CopyMode::HexArrayCurly:
        case CopyMode::HexArraySquare: {
            QString hexchar;
            int i = 0;

            for(char b : bytes) {
                if(!hexchar.isEmpty()) {
                    hexchar += ", ";
                    if(m_options.copybreak && !(++i % m_options.linelength))
                        hexchar += "\n";
                }

                hexchar +=
                    "0x" + QString::number(static_cast<uint>(b), 16).toUpper();
            }

            c->setText(
                QString(mode == CopyMode::HexArraySquare ? "[%1]" : "{%1}")
                    .arg(hexchar));
            break;
        }

        case CopyMode::HexArrayChar: {
            QString hexchar;

            for(char b : bytes)
                hexchar +=
                    "\\x" + QString::number(static_cast<uint>(b), 16).toUpper();

            c->setText(QString("\"%1\"").arg(hexchar));
            break;
        }

        default: {
            QString hexchar;

            for(int i = 0; i < bytes.size(); i++) {
                if(!(i % m_options.grouplength)) {
                    if(!hexchar.isEmpty()) {
                        hexchar += ", ";
                        if(m_options.copybreak && !(i % m_options.linelength))
                            hexchar += "\n";
                    }

                    hexchar += "0x";
                }

                hexchar += QString("%1")
                               .arg(static_cast<uint>(bytes[i]), 2, 16,
                                    QLatin1Char('0'))
                               .toUpper();
            }

            c->setText(hexchar);
            break;
        }
    }
}